

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void Map_Destroy(MAP_HANDLE handle)

{
  ulong uVar1;
  
  if (handle != (MAP_HANDLE)0x0) {
    for (uVar1 = 0; uVar1 < handle->count; uVar1 = uVar1 + 1) {
      free(handle->keys[uVar1]);
      free(handle->values[uVar1]);
    }
    free(handle->keys);
    free(handle->values);
    free(handle);
    return;
  }
  return;
}

Assistant:

void Map_Destroy(MAP_HANDLE handle)
{
    /*Codes_SRS_MAP_02_005: [If parameter handle is NULL then Map_Destroy shall take no action.] */
    if (handle != NULL)
    {
        /*Codes_SRS_MAP_02_004: [Map_Destroy shall release all resources associated with the map.] */
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;
        size_t i;

        for (i = 0; i < handleData->count; i++)
        {
            free(handleData->keys[i]);
            free(handleData->values[i]);
        }
        free(handleData->keys);
        free(handleData->values);
        free(handleData);
    }
}